

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::BVHNIntersector1<4,_1,_true,_embree::avx::SubdivPatch1Intersector1>::occluded
               (Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  ulong uVar57;
  uint uVar58;
  ulong uVar59;
  long lVar60;
  ulong uVar61;
  long lVar62;
  undefined1 (*pauVar63) [16];
  ulong uVar64;
  ulong uVar65;
  Geometry *pGVar66;
  RTCIntersectArguments *pRVar67;
  ulong *puVar68;
  ulong uVar69;
  ulong uVar70;
  float fVar71;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  float fVar85;
  float fVar90;
  float fVar91;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  float fVar96;
  float fVar97;
  float fVar104;
  float fVar105;
  undefined1 auVar98 [16];
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar110;
  float fVar112;
  float fVar114;
  float fVar115;
  undefined1 auVar102 [32];
  float fVar109;
  float fVar111;
  float fVar113;
  undefined1 auVar103 [64];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [64];
  float fVar122;
  float fVar132;
  float fVar133;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  float fVar134;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar131 [64];
  float fVar138;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar141 [64];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  float fVar152;
  undefined1 auVar150 [32];
  undefined1 auVar151 [64];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  float fVar157;
  float fVar166;
  undefined1 auVar158 [32];
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar159 [64];
  float fVar167;
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar170 [64];
  float fVar183;
  undefined1 auVar178 [16];
  float fVar177;
  undefined1 auVar179 [32];
  float fVar181;
  float fVar182;
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar180 [64];
  undefined1 auVar187 [32];
  undefined1 auVar188 [64];
  float fVar189;
  float fVar190;
  undefined1 auVar191 [32];
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  undefined1 auVar192 [64];
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  MapUV<embree::avx::GridSOA::Gather3x3> mapUV;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  ulong local_cd8;
  int local_ccc;
  Ray *local_cc8;
  ulong local_cc0;
  undefined1 (*local_cb8) [16];
  ulong local_cb0;
  ulong local_ca8;
  undefined8 local_ca0;
  float fStack_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  float fStack_c88;
  float fStack_c84;
  undefined8 local_c80;
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  float fStack_c64;
  undefined1 local_c60 [32];
  undefined4 local_c40;
  undefined4 local_c3c;
  undefined4 local_c38;
  undefined4 local_c34;
  undefined4 local_c30;
  undefined4 local_c2c;
  undefined4 local_c28;
  uint local_c24;
  uint local_c20;
  RTCFilterFunctionNArguments local_c10;
  float local_be0;
  float fStack_bdc;
  float fStack_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float fStack_bc8;
  float fStack_bc4;
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [16];
  undefined1 local_b90 [16];
  undefined1 local_b80 [16];
  undefined1 local_b70 [16];
  undefined1 local_b60 [16];
  undefined1 local_b50 [16];
  undefined1 local_b40 [16];
  undefined1 local_b30 [16];
  undefined1 local_b20 [16];
  undefined1 local_b10 [16];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined1 local_940 [32];
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined1 (**local_900) [16];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  ulong local_800;
  ulong local_7f8 [249];
  undefined1 auVar99 [16];
  undefined1 auVar100 [24];
  undefined1 auVar101 [32];
  
  local_800 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_800 != 8) {
    fVar71 = ray->tfar;
    if (0.0 <= fVar71) {
      puVar68 = local_7f8;
      aVar3 = (ray->dir).field_0;
      auVar148 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar116._8_4_ = 0x7fffffff;
      auVar116._0_8_ = 0x7fffffff7fffffff;
      auVar116._12_4_ = 0x7fffffff;
      auVar116 = vandps_avx((undefined1  [16])aVar3,auVar116);
      auVar117._8_4_ = 0x219392ef;
      auVar117._0_8_ = 0x219392ef219392ef;
      auVar117._12_4_ = 0x219392ef;
      auVar116 = vcmpps_avx(auVar116,auVar117,1);
      auVar123._8_4_ = 0x3f800000;
      auVar123._0_8_ = 0x3f8000003f800000;
      auVar123._12_4_ = 0x3f800000;
      auVar117 = vdivps_avx(auVar123,(undefined1  [16])aVar3);
      auVar124._8_4_ = 0x5d5e0b6b;
      auVar124._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar124._12_4_ = 0x5d5e0b6b;
      auVar116 = vblendvps_avx(auVar117,auVar124,auVar116);
      auVar178._0_4_ = auVar116._0_4_ * 0.99999964;
      auVar178._4_4_ = auVar116._4_4_ * 0.99999964;
      auVar178._8_4_ = auVar116._8_4_ * 0.99999964;
      auVar178._12_4_ = auVar116._12_4_ * 0.99999964;
      auVar98._0_4_ = auVar116._0_4_ * 1.0000004;
      auVar98._4_4_ = auVar116._4_4_ * 1.0000004;
      auVar98._8_4_ = auVar116._8_4_ * 1.0000004;
      auVar98._12_4_ = auVar116._12_4_ * 1.0000004;
      uVar1 = *(undefined4 *)&(ray->org).field_0;
      local_b10._4_4_ = uVar1;
      local_b10._0_4_ = uVar1;
      local_b10._8_4_ = uVar1;
      local_b10._12_4_ = uVar1;
      auVar151 = ZEXT1664(local_b10);
      uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_b20._4_4_ = uVar1;
      local_b20._0_4_ = uVar1;
      local_b20._8_4_ = uVar1;
      local_b20._12_4_ = uVar1;
      auVar156 = ZEXT1664(local_b20);
      uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_b30._4_4_ = uVar1;
      local_b30._0_4_ = uVar1;
      local_b30._8_4_ = uVar1;
      local_b30._12_4_ = uVar1;
      auVar159 = ZEXT1664(local_b30);
      local_b40 = vshufps_avx(auVar178,auVar178,0);
      auVar170 = ZEXT1664(local_b40);
      auVar116 = vmovshdup_avx(auVar178);
      local_b50 = vshufps_avx(auVar178,auVar178,0x55);
      auVar180 = ZEXT1664(local_b50);
      auVar117 = vshufpd_avx(auVar178,auVar178,1);
      local_b60 = vshufps_avx(auVar178,auVar178,0xaa);
      auVar121 = ZEXT1664(local_b60);
      local_b70 = vshufps_avx(auVar98,auVar98,0);
      auVar188 = ZEXT1664(local_b70);
      local_b80 = vshufps_avx(auVar98,auVar98,0x55);
      auVar192 = ZEXT1664(local_b80);
      uVar64 = (ulong)(auVar178._0_4_ < 0.0) << 4;
      uVar69 = (ulong)(auVar116._0_4_ < 0.0) << 4 | 0x20;
      local_b90 = vshufps_avx(auVar98,auVar98,0xaa);
      auVar103 = ZEXT1664(local_b90);
      uVar61 = (ulong)(auVar117._0_4_ < 0.0) << 4 | 0x40;
      uVar70 = uVar64 ^ 0x10;
      local_ba0 = vshufps_avx(auVar148,auVar148,0);
      auVar131 = ZEXT1664(local_ba0);
      local_bb0 = vshufps_avx(ZEXT416((uint)fVar71),ZEXT416((uint)fVar71),0);
      auVar141 = ZEXT1664(local_bb0);
      local_a40._16_16_ = mm_lookupmask_ps._240_16_;
      local_a40._0_16_ = mm_lookupmask_ps._240_16_;
      local_cd8 = 0;
      local_cc0 = uVar64;
      local_cc8 = ray;
      do {
        uVar65 = puVar68[-1];
        puVar68 = puVar68 + -1;
        while ((uVar65 & 8) == 0) {
          auVar116 = vsubps_avx(*(undefined1 (*) [16])(uVar65 + 0x20 + uVar64),auVar151._0_16_);
          auVar148._0_4_ = auVar170._0_4_ * auVar116._0_4_;
          auVar148._4_4_ = auVar170._4_4_ * auVar116._4_4_;
          auVar148._8_4_ = auVar170._8_4_ * auVar116._8_4_;
          auVar148._12_4_ = auVar170._12_4_ * auVar116._12_4_;
          auVar116 = vsubps_avx(*(undefined1 (*) [16])(uVar65 + 0x20 + uVar69),auVar156._0_16_);
          auVar80._0_4_ = auVar180._0_4_ * auVar116._0_4_;
          auVar80._4_4_ = auVar180._4_4_ * auVar116._4_4_;
          auVar80._8_4_ = auVar180._8_4_ * auVar116._8_4_;
          auVar80._12_4_ = auVar180._12_4_ * auVar116._12_4_;
          auVar116 = vmaxps_avx(auVar148,auVar80);
          auVar117 = vsubps_avx(*(undefined1 (*) [16])(uVar65 + 0x20 + uVar61),auVar159._0_16_);
          auVar81._0_4_ = auVar121._0_4_ * auVar117._0_4_;
          auVar81._4_4_ = auVar121._4_4_ * auVar117._4_4_;
          auVar81._8_4_ = auVar121._8_4_ * auVar117._8_4_;
          auVar81._12_4_ = auVar121._12_4_ * auVar117._12_4_;
          auVar117 = vmaxps_avx(auVar81,auVar131._0_16_);
          auVar116 = vmaxps_avx(auVar116,auVar117);
          auVar117 = vsubps_avx(*(undefined1 (*) [16])(uVar65 + 0x20 + uVar70),auVar151._0_16_);
          auVar82._0_4_ = auVar188._0_4_ * auVar117._0_4_;
          auVar82._4_4_ = auVar188._4_4_ * auVar117._4_4_;
          auVar82._8_4_ = auVar188._8_4_ * auVar117._8_4_;
          auVar82._12_4_ = auVar188._12_4_ * auVar117._12_4_;
          auVar117 = vsubps_avx(*(undefined1 (*) [16])(uVar65 + 0x20 + (uVar69 ^ 0x10)),
                                auVar156._0_16_);
          auVar86._0_4_ = auVar192._0_4_ * auVar117._0_4_;
          auVar86._4_4_ = auVar192._4_4_ * auVar117._4_4_;
          auVar86._8_4_ = auVar192._8_4_ * auVar117._8_4_;
          auVar86._12_4_ = auVar192._12_4_ * auVar117._12_4_;
          auVar117 = vminps_avx(auVar82,auVar86);
          auVar148 = vsubps_avx(*(undefined1 (*) [16])(uVar65 + 0x20 + (uVar61 ^ 0x10)),
                                auVar159._0_16_);
          auVar87._0_4_ = auVar103._0_4_ * auVar148._0_4_;
          auVar87._4_4_ = auVar103._4_4_ * auVar148._4_4_;
          auVar87._8_4_ = auVar103._8_4_ * auVar148._8_4_;
          auVar87._12_4_ = auVar103._12_4_ * auVar148._12_4_;
          auVar148 = vminps_avx(auVar87,auVar141._0_16_);
          auVar117 = vminps_avx(auVar117,auVar148);
          auVar116 = vcmpps_avx(auVar116,auVar117,2);
          uVar58 = vmovmskps_avx(auVar116);
          if (uVar58 == 0) goto LAB_002c896d;
          uVar58 = uVar58 & 0xff;
          uVar57 = uVar65 & 0xfffffffffffffff0;
          lVar60 = 0;
          if (uVar58 != 0) {
            for (; (uVar58 >> lVar60 & 1) == 0; lVar60 = lVar60 + 1) {
            }
          }
          uVar65 = *(ulong *)(uVar57 + lVar60 * 8);
          uVar58 = uVar58 - 1 & uVar58;
          if (uVar58 != 0) {
            *puVar68 = uVar65;
            puVar68 = puVar68 + 1;
            lVar60 = 0;
            if (uVar58 != 0) {
              for (; (uVar58 >> lVar60 & 1) == 0; lVar60 = lVar60 + 1) {
              }
            }
            uVar65 = *(ulong *)(uVar57 + lVar60 * 8);
            uVar58 = uVar58 - 1 & uVar58;
            uVar59 = (ulong)uVar58;
            if (uVar58 != 0) {
              do {
                *puVar68 = uVar65;
                puVar68 = puVar68 + 1;
                lVar60 = 0;
                if (uVar59 != 0) {
                  for (; (uVar59 >> lVar60 & 1) == 0; lVar60 = lVar60 + 1) {
                  }
                }
                uVar65 = *(ulong *)(uVar57 + lVar60 * 8);
                uVar59 = uVar59 & uVar59 - 1;
              } while (uVar59 != 0);
            }
          }
        }
        if (((uint)uVar65 & 0xf) == 8) {
          uVar58 = *(uint *)(local_cd8 + 0xc);
          local_cb0 = (ulong)uVar58;
          uVar5 = *(uint *)(local_cd8 + 0x10);
          local_ca8 = (ulong)uVar5;
          lVar62 = *(uint *)(local_cd8 + 0x24) + local_cd8;
          uVar65 = uVar65 >> 4;
          lVar60 = lVar62 + uVar65 * 4;
          auVar116 = *(undefined1 (*) [16])(lVar60 + 0x2c + local_cb0 * 4);
          auVar117 = auVar116;
          if (2 < local_ca8) {
            auVar117 = *(undefined1 (*) [16])(lVar62 + uVar65 * 4 + 0x2c + local_cb0 * 8);
          }
          auVar148 = *(undefined1 (*) [16])(lVar62 + 0x2c + uVar65 * 4);
          if (local_cb0 == 2) {
            auVar148 = vshufps_avx(auVar148,auVar148,0x54);
            auVar116 = vshufps_avx(auVar116,auVar116,0x54);
            auVar117 = vshufps_avx(auVar117,auVar117,0x54);
          }
          uVar64 = (ulong)*(uint *)(local_cd8 + 0x14);
          pauVar63 = (undefined1 (*) [16])(lVar60 + uVar64 * 4 + 0x2c);
          auVar98 = *(undefined1 (*) [16])(*pauVar63 + local_cb0 * 4);
          auVar178 = auVar98;
          if (2 < uVar5) {
            auVar178 = *(undefined1 (*) [16])(*pauVar63 + local_cb0 * 8);
          }
          auVar123 = *pauVar63;
          if (uVar58 == 2) {
            auVar123 = vshufps_avx(auVar123,auVar123,0x54);
            auVar98 = vshufps_avx(auVar98,auVar98,0x54);
            auVar178 = vshufps_avx(auVar178,auVar178,0x54);
          }
          pauVar63 = (undefined1 (*) [16])(lVar60 + uVar64 * 8 + 0x2c);
          auVar124 = *(undefined1 (*) [16])(*pauVar63 + local_cb0 * 4);
          auVar80 = auVar124;
          if (2 < uVar5) {
            auVar80 = *(undefined1 (*) [16])(*pauVar63 + local_cb0 * 8);
          }
          auVar153._16_16_ = auVar116;
          auVar153._0_16_ = auVar148;
          auVar72._16_16_ = auVar117;
          auVar72._0_16_ = auVar116;
          auVar24 = vunpcklps_avx(auVar153,auVar72);
          auVar153 = vshufps_avx(auVar153,auVar153,0xa5);
          auVar72 = vshufps_avx(auVar72,auVar72,0x94);
          auVar149._16_16_ = auVar98;
          auVar149._0_16_ = auVar123;
          auVar118._16_16_ = auVar178;
          auVar118._0_16_ = auVar98;
          auVar25 = vunpcklps_avx(auVar149,auVar118);
          auVar149 = vshufps_avx(auVar149,auVar149,0xa5);
          auVar118 = vshufps_avx(auVar118,auVar118,0x94);
          auVar116 = *pauVar63;
          if (uVar58 == 2) {
            auVar116 = vshufps_avx(auVar116,auVar116,0x54);
            auVar124 = vshufps_avx(auVar124,auVar124,0x54);
            auVar80 = vshufps_avx(auVar80,auVar80,0x54);
          }
          auVar119._16_16_ = auVar124;
          auVar119._0_16_ = auVar116;
          auVar125._16_16_ = auVar80;
          auVar125._0_16_ = auVar124;
          auVar26 = vunpcklps_avx(auVar119,auVar125);
          auVar21 = vshufps_avx(auVar119,auVar119,0xa5);
          uVar1 = *(undefined4 *)&(local_cc8->org).field_0;
          auVar168._4_4_ = uVar1;
          auVar168._0_4_ = uVar1;
          auVar168._8_4_ = uVar1;
          auVar168._12_4_ = uVar1;
          auVar168._16_4_ = uVar1;
          auVar168._20_4_ = uVar1;
          auVar168._24_4_ = uVar1;
          auVar168._28_4_ = uVar1;
          uVar1 = *(undefined4 *)((long)&(local_cc8->org).field_0 + 4);
          auVar179._4_4_ = uVar1;
          auVar179._0_4_ = uVar1;
          auVar179._8_4_ = uVar1;
          auVar179._12_4_ = uVar1;
          auVar179._16_4_ = uVar1;
          auVar179._20_4_ = uVar1;
          auVar179._24_4_ = uVar1;
          auVar179._28_4_ = uVar1;
          auVar22 = vshufps_avx(auVar125,auVar125,0x94);
          uVar2 = *(undefined4 *)((long)&(local_cc8->org).field_0 + 8);
          auVar191._4_4_ = uVar2;
          auVar191._0_4_ = uVar2;
          auVar191._8_4_ = uVar2;
          auVar191._12_4_ = uVar2;
          auVar191._16_4_ = uVar2;
          auVar191._20_4_ = uVar2;
          auVar191._24_4_ = uVar2;
          auVar191._28_4_ = uVar2;
          local_a60 = vsubps_avx(auVar24,auVar168);
          local_a80 = vsubps_avx(auVar25,auVar179);
          local_aa0 = vsubps_avx(auVar26,auVar191);
          auVar153 = vsubps_avx(auVar153,auVar168);
          auVar149 = vsubps_avx(auVar149,auVar179);
          auVar24 = vsubps_avx(auVar21,auVar191);
          auVar72 = vsubps_avx(auVar72,auVar168);
          auVar118 = vsubps_avx(auVar118,auVar179);
          auVar25 = vsubps_avx(auVar22,auVar191);
          local_ac0 = vsubps_avx(auVar72,local_a60);
          local_b00 = vsubps_avx(auVar118,local_a80);
          local_ae0 = vsubps_avx(auVar25,local_aa0);
          fVar6 = local_a80._0_4_;
          fVar71 = auVar118._0_4_ + fVar6;
          fVar9 = local_a80._4_4_;
          fVar74 = auVar118._4_4_ + fVar9;
          fVar106 = local_a80._8_4_;
          fVar75 = auVar118._8_4_ + fVar106;
          fVar112 = local_a80._12_4_;
          fVar76 = auVar118._12_4_ + fVar112;
          fVar12 = local_a80._16_4_;
          fVar77 = auVar118._16_4_ + fVar12;
          fVar15 = local_a80._20_4_;
          fVar78 = auVar118._20_4_ + fVar15;
          fVar18 = local_a80._24_4_;
          fVar79 = auVar118._24_4_ + fVar18;
          fVar7 = local_aa0._0_4_;
          fVar157 = auVar25._0_4_ + fVar7;
          fVar10 = local_aa0._4_4_;
          fVar160 = auVar25._4_4_ + fVar10;
          fVar108 = local_aa0._8_4_;
          fVar161 = auVar25._8_4_ + fVar108;
          fVar114 = local_aa0._12_4_;
          fVar162 = auVar25._12_4_ + fVar114;
          fVar13 = local_aa0._16_4_;
          fVar163 = auVar25._16_4_ + fVar13;
          fVar16 = local_aa0._20_4_;
          fVar164 = auVar25._20_4_ + fVar16;
          fVar19 = local_aa0._24_4_;
          fVar165 = auVar25._24_4_ + fVar19;
          fVar97 = local_aa0._28_4_;
          fVar166 = auVar25._28_4_ + fVar97;
          fVar122 = local_ae0._0_4_;
          fVar132 = local_ae0._4_4_;
          auVar21._4_4_ = fVar132 * fVar74;
          auVar21._0_4_ = fVar122 * fVar71;
          fVar133 = local_ae0._8_4_;
          auVar21._8_4_ = fVar133 * fVar75;
          fVar134 = local_ae0._12_4_;
          auVar21._12_4_ = fVar134 * fVar76;
          fVar135 = local_ae0._16_4_;
          auVar21._16_4_ = fVar135 * fVar77;
          fVar136 = local_ae0._20_4_;
          auVar21._20_4_ = fVar136 * fVar78;
          fVar137 = local_ae0._24_4_;
          auVar21._24_4_ = fVar137 * fVar79;
          auVar21._28_4_ = uVar1;
          fVar205 = local_b00._0_4_;
          fVar207 = local_b00._4_4_;
          auVar26._4_4_ = fVar207 * fVar160;
          auVar26._0_4_ = fVar205 * fVar157;
          fVar209 = local_b00._8_4_;
          auVar26._8_4_ = fVar209 * fVar161;
          fVar211 = local_b00._12_4_;
          auVar26._12_4_ = fVar211 * fVar162;
          fVar213 = local_b00._16_4_;
          auVar26._16_4_ = fVar213 * fVar163;
          fVar215 = local_b00._20_4_;
          auVar26._20_4_ = fVar215 * fVar164;
          fVar217 = local_b00._24_4_;
          auVar26._24_4_ = fVar217 * fVar165;
          auVar26._28_4_ = auVar22._28_4_;
          auVar21 = vsubps_avx(auVar26,auVar21);
          fVar8 = local_a60._0_4_;
          fVar177 = auVar72._0_4_ + fVar8;
          fVar11 = local_a60._4_4_;
          fVar181 = auVar72._4_4_ + fVar11;
          fVar110 = local_a60._8_4_;
          fVar182 = auVar72._8_4_ + fVar110;
          fVar115 = local_a60._12_4_;
          fVar183 = auVar72._12_4_ + fVar115;
          fVar14 = local_a60._16_4_;
          fVar184 = auVar72._16_4_ + fVar14;
          fVar17 = local_a60._20_4_;
          fVar185 = auVar72._20_4_ + fVar17;
          fVar20 = local_a60._24_4_;
          fVar186 = auVar72._24_4_ + fVar20;
          fVar152 = auVar72._28_4_;
          fVar167 = local_ac0._0_4_;
          fVar171 = local_ac0._4_4_;
          auVar23._4_4_ = fVar171 * fVar160;
          auVar23._0_4_ = fVar167 * fVar157;
          fVar172 = local_ac0._8_4_;
          auVar23._8_4_ = fVar172 * fVar161;
          fVar173 = local_ac0._12_4_;
          auVar23._12_4_ = fVar173 * fVar162;
          fVar174 = local_ac0._16_4_;
          auVar23._16_4_ = fVar174 * fVar163;
          fVar175 = local_ac0._20_4_;
          auVar23._20_4_ = fVar175 * fVar164;
          fVar176 = local_ac0._24_4_;
          auVar23._24_4_ = fVar176 * fVar165;
          auVar23._28_4_ = fVar166;
          auVar27._4_4_ = fVar181 * fVar132;
          auVar27._0_4_ = fVar177 * fVar122;
          auVar27._8_4_ = fVar182 * fVar133;
          auVar27._12_4_ = fVar183 * fVar134;
          auVar27._16_4_ = fVar184 * fVar135;
          auVar27._20_4_ = fVar185 * fVar136;
          auVar27._24_4_ = fVar186 * fVar137;
          auVar27._28_4_ = auVar22._28_4_;
          auVar22 = vsubps_avx(auVar27,auVar23);
          auVar28._4_4_ = fVar207 * fVar181;
          auVar28._0_4_ = fVar205 * fVar177;
          auVar28._8_4_ = fVar209 * fVar182;
          auVar28._12_4_ = fVar211 * fVar183;
          auVar28._16_4_ = fVar213 * fVar184;
          auVar28._20_4_ = fVar215 * fVar185;
          auVar28._24_4_ = fVar217 * fVar186;
          auVar28._28_4_ = fVar152 + local_a60._28_4_;
          auVar29._4_4_ = fVar171 * fVar74;
          auVar29._0_4_ = fVar167 * fVar71;
          auVar29._8_4_ = fVar172 * fVar75;
          auVar29._12_4_ = fVar173 * fVar76;
          auVar29._16_4_ = fVar174 * fVar77;
          auVar29._20_4_ = fVar175 * fVar78;
          auVar29._24_4_ = fVar176 * fVar79;
          auVar29._28_4_ = auVar118._28_4_ + local_a80._28_4_;
          local_c80._4_4_ = (local_cc8->dir).field_0.m128[2];
          auVar26 = vsubps_avx(auVar29,auVar28);
          local_ca0._4_4_ = (local_cc8->dir).field_0.m128[1];
          fVar71 = (local_cc8->dir).field_0.m128[0];
          local_980._4_4_ = fVar71;
          local_980._0_4_ = fVar71;
          local_980._8_4_ = fVar71;
          local_980._12_4_ = fVar71;
          local_980._16_4_ = fVar71;
          local_980._20_4_ = fVar71;
          local_980._24_4_ = fVar71;
          local_980._28_4_ = fVar71;
          local_be0 = fVar71 * auVar21._0_4_ +
                      local_ca0._4_4_ * auVar22._0_4_ + local_c80._4_4_ * auVar26._0_4_;
          fStack_bdc = fVar71 * auVar21._4_4_ +
                       local_ca0._4_4_ * auVar22._4_4_ + local_c80._4_4_ * auVar26._4_4_;
          fStack_bd8 = fVar71 * auVar21._8_4_ +
                       local_ca0._4_4_ * auVar22._8_4_ + local_c80._4_4_ * auVar26._8_4_;
          fStack_bd4 = fVar71 * auVar21._12_4_ +
                       local_ca0._4_4_ * auVar22._12_4_ + local_c80._4_4_ * auVar26._12_4_;
          fStack_bd0 = fVar71 * auVar21._16_4_ +
                       local_ca0._4_4_ * auVar22._16_4_ + local_c80._4_4_ * auVar26._16_4_;
          fStack_bcc = fVar71 * auVar21._20_4_ +
                       local_ca0._4_4_ * auVar22._20_4_ + local_c80._4_4_ * auVar26._20_4_;
          fStack_bc8 = fVar71 * auVar21._24_4_ +
                       local_ca0._4_4_ * auVar22._24_4_ + local_c80._4_4_ * auVar26._24_4_;
          fStack_bc4 = auVar21._28_4_ + auVar22._28_4_ + auVar26._28_4_;
          local_9e0 = vsubps_avx(local_a80,auVar149);
          local_a00 = vsubps_avx(local_aa0,auVar24);
          fVar75 = fVar6 + auVar149._0_4_;
          fVar77 = fVar9 + auVar149._4_4_;
          fVar79 = fVar106 + auVar149._8_4_;
          fVar160 = fVar112 + auVar149._12_4_;
          fVar162 = fVar12 + auVar149._16_4_;
          fVar164 = fVar15 + auVar149._20_4_;
          fVar177 = fVar18 + auVar149._24_4_;
          fVar78 = auVar24._0_4_ + fVar7;
          fVar157 = auVar24._4_4_ + fVar10;
          fVar161 = auVar24._8_4_ + fVar108;
          fVar163 = auVar24._12_4_ + fVar114;
          fVar165 = auVar24._16_4_ + fVar13;
          fVar181 = auVar24._20_4_ + fVar16;
          fVar182 = auVar24._24_4_ + fVar19;
          fVar206 = local_a00._0_4_;
          fVar208 = local_a00._4_4_;
          auVar22._4_4_ = fVar208 * fVar77;
          auVar22._0_4_ = fVar206 * fVar75;
          fVar210 = local_a00._8_4_;
          auVar22._8_4_ = fVar210 * fVar79;
          fVar212 = local_a00._12_4_;
          auVar22._12_4_ = fVar212 * fVar160;
          fVar214 = local_a00._16_4_;
          auVar22._16_4_ = fVar214 * fVar162;
          fVar216 = local_a00._20_4_;
          auVar22._20_4_ = fVar216 * fVar164;
          fVar218 = local_a00._24_4_;
          auVar22._24_4_ = fVar218 * fVar177;
          auVar22._28_4_ = fVar166;
          fVar189 = local_9e0._0_4_;
          fVar193 = local_9e0._4_4_;
          auVar30._4_4_ = fVar193 * fVar157;
          auVar30._0_4_ = fVar189 * fVar78;
          fVar195 = local_9e0._8_4_;
          auVar30._8_4_ = fVar195 * fVar161;
          fVar197 = local_9e0._12_4_;
          auVar30._12_4_ = fVar197 * fVar163;
          fVar199 = local_9e0._16_4_;
          auVar30._16_4_ = fVar199 * fVar165;
          fVar201 = local_9e0._20_4_;
          auVar30._20_4_ = fVar201 * fVar181;
          fVar203 = local_9e0._24_4_;
          auVar30._24_4_ = fVar203 * fVar182;
          auVar30._28_4_ = fVar97;
          auVar21 = vsubps_avx(auVar30,auVar22);
          auVar22 = vsubps_avx(local_a60,auVar153);
          fVar74 = auVar22._0_4_;
          fVar76 = auVar22._4_4_;
          auVar31._4_4_ = fVar76 * fVar157;
          auVar31._0_4_ = fVar74 * fVar78;
          fVar78 = auVar22._8_4_;
          auVar31._8_4_ = fVar78 * fVar161;
          fVar157 = auVar22._12_4_;
          auVar31._12_4_ = fVar157 * fVar163;
          fVar161 = auVar22._16_4_;
          auVar31._16_4_ = fVar161 * fVar165;
          fVar163 = auVar22._20_4_;
          auVar31._20_4_ = fVar163 * fVar181;
          fVar165 = auVar22._24_4_;
          auVar31._24_4_ = fVar165 * fVar182;
          auVar31._28_4_ = auVar24._28_4_ + fVar97;
          fVar181 = auVar153._0_4_ + fVar8;
          fVar182 = auVar153._4_4_ + fVar11;
          fVar166 = auVar153._8_4_ + fVar110;
          fVar183 = auVar153._12_4_ + fVar115;
          fVar184 = auVar153._16_4_ + fVar14;
          fVar185 = auVar153._20_4_ + fVar17;
          fVar186 = auVar153._24_4_ + fVar20;
          auVar32._4_4_ = fVar208 * fVar182;
          auVar32._0_4_ = fVar206 * fVar181;
          auVar32._8_4_ = fVar210 * fVar166;
          auVar32._12_4_ = fVar212 * fVar183;
          auVar32._16_4_ = fVar214 * fVar184;
          auVar32._20_4_ = fVar216 * fVar185;
          fVar97 = auVar153._28_4_;
          auVar32._24_4_ = fVar218 * fVar186;
          auVar32._28_4_ = fVar97;
          auVar26 = vsubps_avx(auVar32,auVar31);
          auVar33._4_4_ = fVar193 * fVar182;
          auVar33._0_4_ = fVar189 * fVar181;
          auVar33._8_4_ = fVar195 * fVar166;
          auVar33._12_4_ = fVar197 * fVar183;
          auVar33._16_4_ = fVar199 * fVar184;
          auVar33._20_4_ = fVar201 * fVar185;
          auVar33._24_4_ = fVar203 * fVar186;
          auVar33._28_4_ = fVar97;
          auVar34._4_4_ = fVar76 * fVar77;
          auVar34._0_4_ = fVar74 * fVar75;
          auVar34._8_4_ = fVar78 * fVar79;
          auVar34._12_4_ = fVar157 * fVar160;
          auVar34._16_4_ = fVar161 * fVar162;
          auVar34._20_4_ = fVar163 * fVar164;
          auVar34._24_4_ = fVar165 * fVar177;
          auVar34._28_4_ = auVar22._28_4_;
          auVar22 = vsubps_avx(auVar34,auVar33);
          auVar56._4_4_ = fStack_bdc;
          auVar56._0_4_ = local_be0;
          auVar56._8_4_ = fStack_bd8;
          auVar56._12_4_ = fStack_bd4;
          auVar56._16_4_ = fStack_bd0;
          auVar56._20_4_ = fStack_bcc;
          auVar56._24_4_ = fStack_bc8;
          auVar56._28_4_ = fStack_bc4;
          local_940._0_4_ =
               fVar71 * auVar21._0_4_ +
               local_ca0._4_4_ * auVar26._0_4_ + local_c80._4_4_ * auVar22._0_4_;
          local_940._4_4_ =
               fVar71 * auVar21._4_4_ +
               local_ca0._4_4_ * auVar26._4_4_ + local_c80._4_4_ * auVar22._4_4_;
          local_940._8_4_ =
               fVar71 * auVar21._8_4_ +
               local_ca0._4_4_ * auVar26._8_4_ + local_c80._4_4_ * auVar22._8_4_;
          local_940._12_4_ =
               fVar71 * auVar21._12_4_ +
               local_ca0._4_4_ * auVar26._12_4_ + local_c80._4_4_ * auVar22._12_4_;
          local_940._16_4_ =
               fVar71 * auVar21._16_4_ +
               local_ca0._4_4_ * auVar26._16_4_ + local_c80._4_4_ * auVar22._16_4_;
          local_940._20_4_ =
               fVar71 * auVar21._20_4_ +
               local_ca0._4_4_ * auVar26._20_4_ + local_c80._4_4_ * auVar22._20_4_;
          local_940._24_4_ =
               fVar71 * auVar21._24_4_ +
               local_ca0._4_4_ * auVar26._24_4_ + local_c80._4_4_ * auVar22._24_4_;
          local_940._28_4_ = auVar26._28_4_ + auVar26._28_4_ + auVar22._28_4_;
          local_9c0 = vsubps_avx(auVar153,auVar72);
          fVar85 = auVar153._0_4_ + auVar72._0_4_;
          fVar90 = auVar153._4_4_ + auVar72._4_4_;
          fVar91 = auVar153._8_4_ + auVar72._8_4_;
          fVar92 = auVar153._12_4_ + auVar72._12_4_;
          fVar93 = auVar153._16_4_ + auVar72._16_4_;
          fVar94 = auVar153._20_4_ + auVar72._20_4_;
          fVar95 = auVar153._24_4_ + auVar72._24_4_;
          local_9a0 = vsubps_avx(auVar149,auVar118);
          fVar96 = auVar118._0_4_ + auVar149._0_4_;
          fVar104 = auVar118._4_4_ + auVar149._4_4_;
          fVar105 = auVar118._8_4_ + auVar149._8_4_;
          fVar107 = auVar118._12_4_ + auVar149._12_4_;
          fVar109 = auVar118._16_4_ + auVar149._16_4_;
          fVar111 = auVar118._20_4_ + auVar149._20_4_;
          fVar113 = auVar118._24_4_ + auVar149._24_4_;
          auVar22 = vsubps_avx(auVar24,auVar25);
          fVar181 = auVar24._0_4_ + auVar25._0_4_;
          fVar182 = auVar24._4_4_ + auVar25._4_4_;
          fVar166 = auVar24._8_4_ + auVar25._8_4_;
          fVar183 = auVar24._12_4_ + auVar25._12_4_;
          fVar184 = auVar24._16_4_ + auVar25._16_4_;
          fVar185 = auVar24._20_4_ + auVar25._20_4_;
          fVar186 = auVar24._24_4_ + auVar25._24_4_;
          fVar138 = auVar22._0_4_;
          fVar142 = auVar22._4_4_;
          auVar35._4_4_ = fVar142 * fVar104;
          auVar35._0_4_ = fVar138 * fVar96;
          fVar143 = auVar22._8_4_;
          auVar35._8_4_ = fVar143 * fVar105;
          fVar144 = auVar22._12_4_;
          auVar35._12_4_ = fVar144 * fVar107;
          fVar145 = auVar22._16_4_;
          auVar35._16_4_ = fVar145 * fVar109;
          fVar146 = auVar22._20_4_;
          auVar35._20_4_ = fVar146 * fVar111;
          fVar147 = auVar22._24_4_;
          auVar35._24_4_ = fVar147 * fVar113;
          auVar35._28_4_ = auVar21._28_4_;
          fVar75 = local_9a0._0_4_;
          fVar77 = local_9a0._4_4_;
          auVar36._4_4_ = fVar77 * fVar182;
          auVar36._0_4_ = fVar75 * fVar181;
          fVar79 = local_9a0._8_4_;
          auVar36._8_4_ = fVar79 * fVar166;
          fVar160 = local_9a0._12_4_;
          auVar36._12_4_ = fVar160 * fVar183;
          fVar162 = local_9a0._16_4_;
          auVar36._16_4_ = fVar162 * fVar184;
          fVar164 = local_9a0._20_4_;
          auVar36._20_4_ = fVar164 * fVar185;
          fVar177 = local_9a0._24_4_;
          auVar36._24_4_ = fVar177 * fVar186;
          auVar36._28_4_ = fVar152;
          auVar153 = vsubps_avx(auVar36,auVar35);
          fVar190 = local_9c0._0_4_;
          fVar194 = local_9c0._4_4_;
          auVar37._4_4_ = fVar194 * fVar182;
          auVar37._0_4_ = fVar190 * fVar181;
          fVar196 = local_9c0._8_4_;
          auVar37._8_4_ = fVar196 * fVar166;
          fVar198 = local_9c0._12_4_;
          auVar37._12_4_ = fVar198 * fVar183;
          fVar200 = local_9c0._16_4_;
          auVar37._16_4_ = fVar200 * fVar184;
          fVar202 = local_9c0._20_4_;
          auVar37._20_4_ = fVar202 * fVar185;
          fVar204 = local_9c0._24_4_;
          auVar37._24_4_ = fVar204 * fVar186;
          auVar37._28_4_ = auVar24._28_4_ + auVar25._28_4_;
          auVar24._4_4_ = fVar142 * fVar90;
          auVar24._0_4_ = fVar138 * fVar85;
          auVar24._8_4_ = fVar143 * fVar91;
          auVar24._12_4_ = fVar144 * fVar92;
          auVar24._16_4_ = fVar145 * fVar93;
          auVar24._20_4_ = fVar146 * fVar94;
          auVar24._24_4_ = fVar147 * fVar95;
          auVar24._28_4_ = fVar152;
          auVar72 = vsubps_avx(auVar24,auVar37);
          auVar25._4_4_ = fVar77 * fVar90;
          auVar25._0_4_ = fVar75 * fVar85;
          auVar25._8_4_ = fVar79 * fVar91;
          auVar25._12_4_ = fVar160 * fVar92;
          auVar25._16_4_ = fVar162 * fVar93;
          auVar25._20_4_ = fVar164 * fVar94;
          auVar25._24_4_ = fVar177 * fVar95;
          auVar25._28_4_ = fVar97 + fVar152;
          auVar38._4_4_ = fVar194 * fVar104;
          auVar38._0_4_ = fVar190 * fVar96;
          auVar38._8_4_ = fVar196 * fVar105;
          auVar38._12_4_ = fVar198 * fVar107;
          auVar38._16_4_ = fVar200 * fVar109;
          auVar38._20_4_ = fVar202 * fVar111;
          auVar38._24_4_ = fVar204 * fVar113;
          auVar38._28_4_ = auVar118._28_4_ + auVar149._28_4_;
          auVar149 = vsubps_avx(auVar38,auVar25);
          local_c80._0_4_ = local_c80._4_4_;
          fStack_c78 = local_c80._4_4_;
          fStack_c74 = local_c80._4_4_;
          fStack_c70 = local_c80._4_4_;
          fStack_c6c = local_c80._4_4_;
          fStack_c68 = local_c80._4_4_;
          fStack_c64 = local_c80._4_4_;
          local_ca0._0_4_ = local_ca0._4_4_;
          fStack_c98 = local_ca0._4_4_;
          fStack_c94 = local_ca0._4_4_;
          fStack_c90 = local_ca0._4_4_;
          fStack_c8c = local_ca0._4_4_;
          fStack_c88 = local_ca0._4_4_;
          fStack_c84 = local_ca0._4_4_;
          auVar83._0_4_ =
               fVar71 * auVar153._0_4_ +
               local_ca0._4_4_ * auVar72._0_4_ + local_c80._4_4_ * auVar149._0_4_;
          auVar83._4_4_ =
               fVar71 * auVar153._4_4_ +
               local_ca0._4_4_ * auVar72._4_4_ + local_c80._4_4_ * auVar149._4_4_;
          auVar83._8_4_ =
               fVar71 * auVar153._8_4_ +
               local_ca0._4_4_ * auVar72._8_4_ + local_c80._4_4_ * auVar149._8_4_;
          auVar83._12_4_ =
               fVar71 * auVar153._12_4_ +
               local_ca0._4_4_ * auVar72._12_4_ + local_c80._4_4_ * auVar149._12_4_;
          auVar83._16_4_ =
               fVar71 * auVar153._16_4_ +
               local_ca0._4_4_ * auVar72._16_4_ + local_c80._4_4_ * auVar149._16_4_;
          auVar83._20_4_ =
               fVar71 * auVar153._20_4_ +
               local_ca0._4_4_ * auVar72._20_4_ + local_c80._4_4_ * auVar149._20_4_;
          auVar83._24_4_ =
               fVar71 * auVar153._24_4_ +
               local_ca0._4_4_ * auVar72._24_4_ + local_c80._4_4_ * auVar149._24_4_;
          auVar83._28_4_ = auVar149._28_4_ + auVar72._28_4_ + auVar149._28_4_;
          fVar97 = auVar83._0_4_ + local_be0 + local_940._0_4_;
          fVar182 = auVar83._4_4_ + fStack_bdc + local_940._4_4_;
          auVar99._0_8_ = CONCAT44(fVar182,fVar97);
          auVar99._8_4_ = auVar83._8_4_ + fStack_bd8 + local_940._8_4_;
          auVar99._12_4_ = auVar83._12_4_ + fStack_bd4 + local_940._12_4_;
          auVar100._16_4_ = auVar83._16_4_ + fStack_bd0 + local_940._16_4_;
          auVar100._0_16_ = auVar99;
          auVar100._20_4_ = auVar83._20_4_ + fStack_bcc + local_940._20_4_;
          auVar101._24_4_ = auVar83._24_4_ + fStack_bc8 + local_940._24_4_;
          auVar101._0_24_ = auVar100;
          auVar101._28_4_ = auVar83._28_4_ + fStack_bc4 + local_940._28_4_;
          auVar153 = vminps_avx(auVar56,local_940);
          auVar153 = vminps_avx(auVar153,auVar83);
          auVar154._8_4_ = 0x7fffffff;
          auVar154._0_8_ = 0x7fffffff7fffffff;
          auVar154._12_4_ = 0x7fffffff;
          auVar154._16_4_ = 0x7fffffff;
          auVar154._20_4_ = 0x7fffffff;
          auVar154._24_4_ = 0x7fffffff;
          auVar154._28_4_ = 0x7fffffff;
          local_c60 = auVar101;
          auVar24 = local_c60;
          local_a20 = vandps_avx(auVar154,auVar101);
          fVar181 = local_a20._0_4_ * 1.1920929e-07;
          fVar166 = local_a20._4_4_ * 1.1920929e-07;
          auVar39._4_4_ = fVar166;
          auVar39._0_4_ = fVar181;
          fVar183 = local_a20._8_4_ * 1.1920929e-07;
          auVar39._8_4_ = fVar183;
          fVar184 = local_a20._12_4_ * 1.1920929e-07;
          auVar39._12_4_ = fVar184;
          fVar185 = local_a20._16_4_ * 1.1920929e-07;
          auVar39._16_4_ = fVar185;
          fVar186 = local_a20._20_4_ * 1.1920929e-07;
          auVar39._20_4_ = fVar186;
          fVar85 = local_a20._24_4_ * 1.1920929e-07;
          auVar39._24_4_ = fVar85;
          auVar39._28_4_ = 0x34000000;
          auVar120._0_8_ = CONCAT44(fVar166,fVar181) ^ 0x8000000080000000;
          auVar120._8_4_ = -fVar183;
          auVar120._12_4_ = -fVar184;
          auVar120._16_4_ = -fVar185;
          auVar120._20_4_ = -fVar186;
          auVar120._24_4_ = -fVar85;
          auVar120._28_4_ = 0xb4000000;
          auVar153 = vcmpps_avx(auVar153,auVar120,5);
          auVar149 = vmaxps_avx(auVar56,local_940);
          auVar72 = vmaxps_avx(auVar149,auVar83);
          auVar72 = vcmpps_avx(auVar72,auVar39,2);
          auVar72 = vorps_avx(auVar153,auVar72);
          local_cb8 = (undefined1 (*) [16])(uVar64 * 0xc + lVar60 + 0x2c);
          auVar118 = local_a40 & auVar72;
          if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar118 >> 0x7f,0) != '\0') ||
                (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar118 >> 0xbf,0) != '\0') ||
              (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar118[0x1f] < '\0') {
            auVar40._4_4_ = fVar193 * fVar132;
            auVar40._0_4_ = fVar189 * fVar122;
            auVar40._8_4_ = fVar195 * fVar133;
            auVar40._12_4_ = fVar197 * fVar134;
            auVar40._16_4_ = fVar199 * fVar135;
            auVar40._20_4_ = fVar201 * fVar136;
            auVar40._24_4_ = fVar203 * fVar137;
            auVar40._28_4_ = local_a40._28_4_;
            auVar41._4_4_ = fVar207 * fVar208;
            auVar41._0_4_ = fVar205 * fVar206;
            auVar41._8_4_ = fVar209 * fVar210;
            auVar41._12_4_ = fVar211 * fVar212;
            auVar41._16_4_ = fVar213 * fVar214;
            auVar41._20_4_ = fVar215 * fVar216;
            auVar41._24_4_ = fVar217 * fVar218;
            auVar41._28_4_ = auVar153._28_4_;
            auVar118 = vsubps_avx(auVar41,auVar40);
            auVar42._4_4_ = fVar208 * fVar77;
            auVar42._0_4_ = fVar206 * fVar75;
            auVar42._8_4_ = fVar210 * fVar79;
            auVar42._12_4_ = fVar212 * fVar160;
            auVar42._16_4_ = fVar214 * fVar162;
            auVar42._20_4_ = fVar216 * fVar164;
            auVar42._24_4_ = fVar218 * fVar177;
            auVar42._28_4_ = 0x34000000;
            auVar43._4_4_ = fVar193 * fVar142;
            auVar43._0_4_ = fVar189 * fVar138;
            auVar43._8_4_ = fVar195 * fVar143;
            auVar43._12_4_ = fVar197 * fVar144;
            auVar43._16_4_ = fVar199 * fVar145;
            auVar43._20_4_ = fVar201 * fVar146;
            auVar43._24_4_ = fVar203 * fVar147;
            auVar43._28_4_ = auVar149._28_4_;
            auVar25 = vsubps_avx(auVar43,auVar42);
            auVar153 = vandps_avx(auVar154,auVar40);
            auVar149 = vandps_avx(auVar154,auVar42);
            auVar153 = vcmpps_avx(auVar153,auVar149,1);
            local_860 = vblendvps_avx(auVar25,auVar118,auVar153);
            auVar44._4_4_ = fVar76 * fVar142;
            auVar44._0_4_ = fVar74 * fVar138;
            auVar44._8_4_ = fVar78 * fVar143;
            auVar44._12_4_ = fVar157 * fVar144;
            auVar44._16_4_ = fVar161 * fVar145;
            auVar44._20_4_ = fVar163 * fVar146;
            auVar44._24_4_ = fVar165 * fVar147;
            auVar44._28_4_ = auVar118._28_4_;
            auVar45._4_4_ = fVar76 * fVar132;
            auVar45._0_4_ = fVar74 * fVar122;
            auVar45._8_4_ = fVar78 * fVar133;
            auVar45._12_4_ = fVar157 * fVar134;
            auVar45._16_4_ = fVar161 * fVar135;
            auVar45._20_4_ = fVar163 * fVar136;
            auVar45._24_4_ = fVar165 * fVar137;
            auVar45._28_4_ = auVar149._28_4_;
            auVar46._4_4_ = fVar171 * fVar208;
            auVar46._0_4_ = fVar167 * fVar206;
            auVar46._8_4_ = fVar172 * fVar210;
            auVar46._12_4_ = fVar173 * fVar212;
            auVar46._16_4_ = fVar174 * fVar214;
            auVar46._20_4_ = fVar175 * fVar216;
            auVar46._24_4_ = fVar176 * fVar218;
            auVar46._28_4_ = auVar25._28_4_;
            auVar118 = vsubps_avx(auVar45,auVar46);
            auVar47._4_4_ = fVar208 * fVar194;
            auVar47._0_4_ = fVar206 * fVar190;
            auVar47._8_4_ = fVar210 * fVar196;
            auVar47._12_4_ = fVar212 * fVar198;
            auVar47._16_4_ = fVar214 * fVar200;
            auVar47._20_4_ = fVar216 * fVar202;
            auVar47._24_4_ = fVar218 * fVar204;
            auVar47._28_4_ = auVar22._28_4_;
            auVar25 = vsubps_avx(auVar47,auVar44);
            auVar153 = vandps_avx(auVar154,auVar46);
            auVar149 = vandps_avx(auVar154,auVar44);
            auVar149 = vcmpps_avx(auVar153,auVar149,1);
            local_840 = vblendvps_avx(auVar25,auVar118,auVar149);
            auVar48._4_4_ = fVar193 * fVar194;
            auVar48._0_4_ = fVar189 * fVar190;
            auVar48._8_4_ = fVar195 * fVar196;
            auVar48._12_4_ = fVar197 * fVar198;
            auVar48._16_4_ = fVar199 * fVar200;
            auVar48._20_4_ = fVar201 * fVar202;
            auVar48._24_4_ = fVar203 * fVar204;
            auVar48._28_4_ = auVar72._28_4_;
            auVar49._4_4_ = fVar171 * fVar193;
            auVar49._0_4_ = fVar167 * fVar189;
            auVar49._8_4_ = fVar172 * fVar195;
            auVar49._12_4_ = fVar173 * fVar197;
            auVar49._16_4_ = fVar174 * fVar199;
            auVar49._20_4_ = fVar175 * fVar201;
            auVar49._24_4_ = fVar176 * fVar203;
            auVar49._28_4_ = auVar149._28_4_;
            auVar50._4_4_ = fVar207 * fVar76;
            auVar50._0_4_ = fVar205 * fVar74;
            auVar50._8_4_ = fVar209 * fVar78;
            auVar50._12_4_ = fVar211 * fVar157;
            auVar50._16_4_ = fVar213 * fVar161;
            auVar50._20_4_ = fVar215 * fVar163;
            auVar50._24_4_ = fVar217 * fVar165;
            auVar50._28_4_ = auVar118._28_4_;
            auVar51._4_4_ = fVar76 * fVar77;
            auVar51._0_4_ = fVar74 * fVar75;
            auVar51._8_4_ = fVar78 * fVar79;
            auVar51._12_4_ = fVar157 * fVar160;
            auVar51._16_4_ = fVar161 * fVar162;
            auVar51._20_4_ = fVar163 * fVar164;
            auVar51._24_4_ = fVar165 * fVar177;
            auVar51._28_4_ = auVar153._28_4_;
            auVar118 = vsubps_avx(auVar49,auVar50);
            auVar25 = vsubps_avx(auVar51,auVar48);
            auVar153 = vandps_avx(auVar154,auVar50);
            auVar149 = vandps_avx(auVar154,auVar48);
            auVar149 = vcmpps_avx(auVar153,auVar149,1);
            local_820 = vblendvps_avx(auVar25,auVar118,auVar149);
            fVar74 = auVar153._28_4_;
            fVar75 = local_860._0_4_ * fVar71 +
                     local_840._0_4_ * local_ca0._4_4_ + local_820._0_4_ * local_c80._4_4_;
            fVar76 = local_860._4_4_ * fVar71 +
                     local_840._4_4_ * local_ca0._4_4_ + local_820._4_4_ * local_c80._4_4_;
            fVar77 = local_860._8_4_ * fVar71 +
                     local_840._8_4_ * local_ca0._4_4_ + local_820._8_4_ * local_c80._4_4_;
            fVar78 = local_860._12_4_ * fVar71 +
                     local_840._12_4_ * local_ca0._4_4_ + local_820._12_4_ * local_c80._4_4_;
            fVar79 = local_860._16_4_ * fVar71 +
                     local_840._16_4_ * local_ca0._4_4_ + local_820._16_4_ * local_c80._4_4_;
            fVar157 = local_860._20_4_ * fVar71 +
                      local_840._20_4_ * local_ca0._4_4_ + local_820._20_4_ * local_c80._4_4_;
            fVar71 = local_860._24_4_ * fVar71 +
                     local_840._24_4_ * local_ca0._4_4_ + local_820._24_4_ * local_c80._4_4_;
            fVar160 = fVar74 + fVar74 + auVar118._28_4_;
            auVar88._0_4_ = fVar75 + fVar75;
            auVar88._4_4_ = fVar76 + fVar76;
            auVar88._8_4_ = fVar77 + fVar77;
            auVar88._12_4_ = fVar78 + fVar78;
            auVar88._16_4_ = fVar79 + fVar79;
            auVar88._20_4_ = fVar157 + fVar157;
            auVar88._24_4_ = fVar71 + fVar71;
            auVar88._28_4_ = fVar160 + fVar160;
            fVar75 = auVar25._28_4_;
            auVar153 = vrcpps_avx(auVar88);
            fVar76 = local_860._0_4_ * fVar8 + local_840._0_4_ * fVar6 + local_820._0_4_ * fVar7;
            fVar77 = local_860._4_4_ * fVar11 + local_840._4_4_ * fVar9 + local_820._4_4_ * fVar10;
            fVar106 = local_860._8_4_ * fVar110 +
                      local_840._8_4_ * fVar106 + local_820._8_4_ * fVar108;
            fVar108 = local_860._12_4_ * fVar115 +
                      local_840._12_4_ * fVar112 + local_820._12_4_ * fVar114;
            fVar110 = local_860._16_4_ * fVar14 +
                      local_840._16_4_ * fVar12 + local_820._16_4_ * fVar13;
            fVar112 = local_860._20_4_ * fVar17 +
                      local_840._20_4_ * fVar15 + local_820._20_4_ * fVar16;
            fVar114 = local_860._24_4_ * fVar20 +
                      local_840._24_4_ * fVar18 + local_820._24_4_ * fVar19;
            fVar115 = fVar75 + fVar75 + fVar74;
            fVar71 = auVar153._0_4_;
            fVar6 = auVar153._4_4_;
            auVar52._4_4_ = auVar88._4_4_ * fVar6;
            auVar52._0_4_ = auVar88._0_4_ * fVar71;
            fVar7 = auVar153._8_4_;
            auVar52._8_4_ = auVar88._8_4_ * fVar7;
            fVar8 = auVar153._12_4_;
            auVar52._12_4_ = auVar88._12_4_ * fVar8;
            fVar9 = auVar153._16_4_;
            auVar52._16_4_ = auVar88._16_4_ * fVar9;
            fVar10 = auVar153._20_4_;
            auVar52._20_4_ = auVar88._20_4_ * fVar10;
            fVar11 = auVar153._24_4_;
            auVar52._24_4_ = auVar88._24_4_ * fVar11;
            auVar52._28_4_ = fVar75;
            auVar139._8_4_ = 0x3f800000;
            auVar139._0_8_ = 0x3f8000003f800000;
            auVar139._12_4_ = 0x3f800000;
            auVar139._16_4_ = 0x3f800000;
            auVar139._20_4_ = 0x3f800000;
            auVar139._24_4_ = 0x3f800000;
            auVar139._28_4_ = 0x3f800000;
            auVar153 = vsubps_avx(auVar139,auVar52);
            uVar1 = *(undefined4 *)((long)&(local_cc8->org).field_0 + 0xc);
            auVar126._4_4_ = uVar1;
            auVar126._0_4_ = uVar1;
            auVar126._8_4_ = uVar1;
            auVar126._12_4_ = uVar1;
            auVar126._16_4_ = uVar1;
            auVar126._20_4_ = uVar1;
            auVar126._24_4_ = uVar1;
            auVar126._28_4_ = uVar1;
            local_880._4_4_ = (fVar77 + fVar77) * (fVar6 + fVar6 * auVar153._4_4_);
            local_880._0_4_ = (fVar76 + fVar76) * (fVar71 + fVar71 * auVar153._0_4_);
            local_880._8_4_ = (fVar106 + fVar106) * (fVar7 + fVar7 * auVar153._8_4_);
            local_880._12_4_ = (fVar108 + fVar108) * (fVar8 + fVar8 * auVar153._12_4_);
            local_880._16_4_ = (fVar110 + fVar110) * (fVar9 + fVar9 * auVar153._16_4_);
            local_880._20_4_ = (fVar112 + fVar112) * (fVar10 + fVar10 * auVar153._20_4_);
            local_880._24_4_ = (fVar114 + fVar114) * (fVar11 + fVar11 * auVar153._24_4_);
            local_880._28_4_ = fVar115 + fVar115;
            auVar153 = vcmpps_avx(auVar126,local_880,2);
            fVar71 = local_cc8->tfar;
            auVar127._4_4_ = fVar71;
            auVar127._0_4_ = fVar71;
            auVar127._8_4_ = fVar71;
            auVar127._12_4_ = fVar71;
            auVar127._16_4_ = fVar71;
            auVar127._20_4_ = fVar71;
            auVar127._24_4_ = fVar71;
            auVar127._28_4_ = fVar71;
            auVar149 = vcmpps_avx(local_880,auVar127,2);
            auVar153 = vandps_avx(auVar153,auVar149);
            auVar149 = vcmpps_avx(auVar88,_DAT_01faff00,4);
            auVar153 = vandps_avx(auVar149,auVar153);
            auVar116 = vpslld_avx(auVar153._0_16_,0x1f);
            auVar117 = vpsrad_avx(auVar116,0x1f);
            auVar116 = vpslld_avx(auVar153._16_16_,0x1f);
            auVar116 = vpsrad_avx(auVar116,0x1f);
            auVar89._16_16_ = auVar116;
            auVar89._0_16_ = auVar117;
            auVar153 = vandps_avx(auVar72,local_a40);
            auVar72 = auVar153 & auVar89;
            if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar72 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar72 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar72 >> 0x7f,0) != '\0') ||
                  (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar72 >> 0xbf,0) != '\0') ||
                (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar72[0x1f] < '\0') {
              uVar64 = CONCAT44(0,*(uint *)(local_cd8 + 0x18));
              auVar4._0_4_ = local_cc8->tfar;
              auVar4._4_4_ = local_cc8->mask;
              auVar4._8_4_ = local_cc8->id;
              auVar4._12_4_ = local_cc8->flags;
              local_8e0 = vandps_avx(auVar89,auVar153);
              uVar58 = vextractps_avx(auVar4,1);
              local_960 = CONCAT44(fStack_bdc,local_be0);
              uStack_958 = CONCAT44(fStack_bd4,fStack_bd8);
              uStack_950 = CONCAT44(fStack_bcc,fStack_bd0);
              uStack_948 = CONCAT44(fStack_bc4,fStack_bc8);
              local_c60._8_8_ = auVar99._8_8_;
              local_c60._16_8_ = auVar100._16_8_;
              local_c60._24_8_ = auVar101._24_8_;
              local_920 = auVar99._0_8_;
              uStack_918 = local_c60._8_8_;
              uStack_910 = local_c60._16_8_;
              uStack_908 = local_c60._24_8_;
              local_900 = &local_cb8;
              pGVar66 = (context->scene->geometries).items[uVar64].ptr;
              if ((pGVar66->mask & uVar58) != 0) {
                pRVar67 = context->args;
                if ((pRVar67->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar66->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_002c89f7:
                  local_cc8->tfar = -INFINITY;
                  return;
                }
                auVar116 = *(undefined1 (*) [16])(*local_cb8 + local_cb0 * 4);
                auVar117 = auVar116;
                if (2 < local_ca8) {
                  auVar117 = *(undefined1 (*) [16])(*local_cb8 + local_cb0 * 8);
                }
                local_ae0._0_8_ = puVar68;
                local_b00._0_8_ = context;
                auVar153 = vrcpps_avx(auVar101);
                fVar71 = auVar153._0_4_;
                fVar6 = auVar153._4_4_;
                auVar53._4_4_ = fVar182 * fVar6;
                auVar53._0_4_ = fVar97 * fVar71;
                fVar7 = auVar153._8_4_;
                auVar53._8_4_ = auVar99._8_4_ * fVar7;
                fVar8 = auVar153._12_4_;
                auVar53._12_4_ = auVar99._12_4_ * fVar8;
                fVar9 = auVar153._16_4_;
                auVar53._16_4_ = auVar100._16_4_ * fVar9;
                fVar10 = auVar153._20_4_;
                auVar53._20_4_ = auVar100._20_4_ * fVar10;
                fVar11 = auVar153._24_4_;
                auVar53._24_4_ = auVar101._24_4_ * fVar11;
                auVar53._28_4_ = auVar101._28_4_;
                auVar128._8_4_ = 0x3f800000;
                auVar128._0_8_ = 0x3f8000003f800000;
                auVar128._12_4_ = 0x3f800000;
                auVar128._16_4_ = 0x3f800000;
                auVar128._20_4_ = 0x3f800000;
                auVar128._24_4_ = 0x3f800000;
                auVar128._28_4_ = 0x3f800000;
                auVar72 = vsubps_avx(auVar128,auVar53);
                auVar73._0_4_ = fVar71 + fVar71 * auVar72._0_4_;
                auVar73._4_4_ = fVar6 + fVar6 * auVar72._4_4_;
                auVar73._8_4_ = fVar7 + fVar7 * auVar72._8_4_;
                auVar73._12_4_ = fVar8 + fVar8 * auVar72._12_4_;
                auVar73._16_4_ = fVar9 + fVar9 * auVar72._16_4_;
                auVar73._20_4_ = fVar10 + fVar10 * auVar72._20_4_;
                auVar73._24_4_ = fVar11 + fVar11 * auVar72._24_4_;
                auVar73._28_4_ = auVar153._28_4_ + auVar72._28_4_;
                auVar84._8_4_ = 0x219392ef;
                auVar84._0_8_ = 0x219392ef219392ef;
                auVar84._12_4_ = 0x219392ef;
                auVar84._16_4_ = 0x219392ef;
                auVar84._20_4_ = 0x219392ef;
                auVar84._24_4_ = 0x219392ef;
                auVar84._28_4_ = 0x219392ef;
                auVar153 = vcmpps_avx(local_a20,auVar84,5);
                auVar153 = vandps_avx(auVar153,auVar73);
                auVar54._4_4_ = auVar153._4_4_ * fStack_bdc;
                auVar54._0_4_ = auVar153._0_4_ * local_be0;
                auVar54._8_4_ = auVar153._8_4_ * fStack_bd8;
                auVar54._12_4_ = auVar153._12_4_ * fStack_bd4;
                auVar54._16_4_ = auVar153._16_4_ * fStack_bd0;
                auVar54._20_4_ = auVar153._20_4_ * fStack_bcc;
                auVar54._24_4_ = auVar153._24_4_ * fStack_bc8;
                auVar54._28_4_ = auVar73._28_4_;
                auVar72 = vminps_avx(auVar54,auVar128);
                auVar55._4_4_ = local_940._4_4_ * auVar153._4_4_;
                auVar55._0_4_ = local_940._0_4_ * auVar153._0_4_;
                auVar55._8_4_ = local_940._8_4_ * auVar153._8_4_;
                auVar55._12_4_ = local_940._12_4_ * auVar153._12_4_;
                auVar55._16_4_ = local_940._16_4_ * auVar153._16_4_;
                auVar55._20_4_ = local_940._20_4_ * auVar153._20_4_;
                auVar55._24_4_ = local_940._24_4_ * auVar153._24_4_;
                auVar55._28_4_ = auVar153._28_4_;
                auVar153 = vminps_avx(auVar55,auVar128);
                auVar148 = *local_cb8;
                if (local_cb0 == 2) {
                  auVar148 = vpshufd_avx(auVar148,0x54);
                  auVar116 = vpshufd_avx(auVar116,0x54);
                  auVar117 = vpshufd_avx(auVar117,0x54);
                }
                auVar140._16_16_ = auVar116;
                auVar140._0_16_ = auVar148;
                auVar150._16_16_ = auVar117;
                auVar150._0_16_ = auVar116;
                auVar149 = vunpcklps_avx(auVar140,auVar150);
                auVar148 = vpshufd_avx(auVar148,0xa5);
                auVar98 = vpshufd_avx(auVar116,0xa5);
                auVar155._16_16_ = auVar98;
                auVar155._0_16_ = auVar148;
                auVar116 = vpshufd_avx(auVar116,0x94);
                auVar117 = vpshufd_avx(auVar117,0x94);
                auVar158._16_16_ = auVar117;
                auVar158._0_16_ = auVar116;
                auVar169._0_16_ = vpsrld_avx(auVar149._0_16_,0x10);
                auVar178 = vpsrld_avx(auVar149._16_16_,0x10);
                auVar187._8_4_ = 0xffff;
                auVar187._0_8_ = 0xffff0000ffff;
                auVar187._12_4_ = 0xffff;
                auVar187._16_4_ = 0xffff;
                auVar187._20_4_ = 0xffff;
                auVar187._24_4_ = 0xffff;
                auVar187._28_4_ = 0xffff;
                auVar149 = vandps_avx(auVar187,auVar149);
                auVar118 = vcvtdq2ps_avx(auVar149);
                auVar169._16_16_ = auVar178;
                auVar25 = vcvtdq2ps_avx(auVar169);
                auVar129._0_16_ = vpsrld_avx(auVar148,0x10);
                auVar148 = vpsrld_avx(auVar98,0x10);
                auVar149 = vandps_avx(auVar155,auVar187);
                auVar21 = vcvtdq2ps_avx(auVar149);
                auVar129._16_16_ = auVar148;
                auVar22 = vcvtdq2ps_avx(auVar129);
                auVar102._0_16_ = vpsrld_avx(auVar116,0x10);
                auVar116 = vpsrld_avx(auVar117,0x10);
                auVar149 = vandps_avx(auVar158,auVar187);
                auVar149 = vcvtdq2ps_avx(auVar149);
                auVar102._16_16_ = auVar116;
                auVar26 = vcvtdq2ps_avx(auVar102);
                auVar130._8_4_ = 0x3f800000;
                auVar130._0_8_ = 0x3f8000003f800000;
                auVar130._12_4_ = 0x3f800000;
                auVar130._16_4_ = 0x3f800000;
                auVar130._20_4_ = 0x3f800000;
                auVar130._24_4_ = 0x3f800000;
                auVar130._28_4_ = 0x3f800000;
                auVar23 = vsubps_avx(auVar130,auVar72);
                auVar23 = vsubps_avx(auVar23,auVar153);
                local_8c0._0_4_ =
                     auVar153._0_4_ * auVar149._0_4_ * 0.00012207031 +
                     auVar21._0_4_ * 0.00012207031 * auVar72._0_4_ +
                     auVar23._0_4_ * auVar118._0_4_ * 0.00012207031;
                local_8c0._4_4_ =
                     auVar153._4_4_ * auVar149._4_4_ * 0.00012207031 +
                     auVar21._4_4_ * 0.00012207031 * auVar72._4_4_ +
                     auVar23._4_4_ * auVar118._4_4_ * 0.00012207031;
                local_8c0._8_4_ =
                     auVar153._8_4_ * auVar149._8_4_ * 0.00012207031 +
                     auVar21._8_4_ * 0.00012207031 * auVar72._8_4_ +
                     auVar23._8_4_ * auVar118._8_4_ * 0.00012207031;
                local_8c0._12_4_ =
                     auVar153._12_4_ * auVar149._12_4_ * 0.00012207031 +
                     auVar21._12_4_ * 0.00012207031 * auVar72._12_4_ +
                     auVar23._12_4_ * auVar118._12_4_ * 0.00012207031;
                local_8c0._16_4_ =
                     auVar153._16_4_ * auVar149._16_4_ * 0.00012207031 +
                     auVar21._16_4_ * 0.00012207031 * auVar72._16_4_ +
                     auVar23._16_4_ * auVar118._16_4_ * 0.00012207031;
                local_8c0._20_4_ =
                     auVar153._20_4_ * auVar149._20_4_ * 0.00012207031 +
                     auVar21._20_4_ * 0.00012207031 * auVar72._20_4_ +
                     auVar23._20_4_ * auVar118._20_4_ * 0.00012207031;
                local_8c0._24_4_ =
                     auVar153._24_4_ * auVar149._24_4_ * 0.00012207031 +
                     auVar21._24_4_ * 0.00012207031 * auVar72._24_4_ +
                     auVar23._24_4_ * auVar118._24_4_ * 0.00012207031;
                local_8c0._28_4_ = auVar149._28_4_ + 0.0 + auVar153._28_4_;
                local_8a0._0_4_ =
                     auVar153._0_4_ * auVar26._0_4_ * 0.00012207031 +
                     auVar72._0_4_ * auVar22._0_4_ * 0.00012207031 +
                     auVar25._0_4_ * 0.00012207031 * auVar23._0_4_;
                local_8a0._4_4_ =
                     auVar153._4_4_ * auVar26._4_4_ * 0.00012207031 +
                     auVar72._4_4_ * auVar22._4_4_ * 0.00012207031 +
                     auVar25._4_4_ * 0.00012207031 * auVar23._4_4_;
                local_8a0._8_4_ =
                     auVar153._8_4_ * auVar26._8_4_ * 0.00012207031 +
                     auVar72._8_4_ * auVar22._8_4_ * 0.00012207031 +
                     auVar25._8_4_ * 0.00012207031 * auVar23._8_4_;
                local_8a0._12_4_ =
                     auVar153._12_4_ * auVar26._12_4_ * 0.00012207031 +
                     auVar72._12_4_ * auVar22._12_4_ * 0.00012207031 +
                     auVar25._12_4_ * 0.00012207031 * auVar23._12_4_;
                local_8a0._16_4_ =
                     auVar153._16_4_ * auVar26._16_4_ * 0.00012207031 +
                     auVar72._16_4_ * auVar22._16_4_ * 0.00012207031 +
                     auVar25._16_4_ * 0.00012207031 * auVar23._16_4_;
                local_8a0._20_4_ =
                     auVar153._20_4_ * auVar26._20_4_ * 0.00012207031 +
                     auVar72._20_4_ * auVar22._20_4_ * 0.00012207031 +
                     auVar25._20_4_ * 0.00012207031 * auVar23._20_4_;
                local_8a0._24_4_ =
                     auVar153._24_4_ * auVar26._24_4_ * 0.00012207031 +
                     auVar72._24_4_ * auVar22._24_4_ * 0.00012207031 +
                     auVar25._24_4_ * 0.00012207031 * auVar23._24_4_;
                local_8a0._28_4_ = auVar26._28_4_ + auVar22._28_4_ + auVar23._28_4_;
                uVar58 = vmovmskps_avx(local_8e0);
                uVar65 = (ulong)uVar58;
                lVar60 = 0;
                if (uVar65 != 0) {
                  for (; (uVar58 >> lVar60 & 1) == 0; lVar60 = lVar60 + 1) {
                  }
                }
                if (uVar58 != 0) {
                  local_a60._0_8_ = context->user;
                  local_c80 = pRVar67;
                  local_a80._0_8_ = uVar64;
                  local_aa0._0_4_ = *(undefined4 *)(local_cd8 + 0x1c);
                  local_ac0._0_16_ = auVar4;
                  local_ca0 = pGVar66;
                  local_c2c = *(undefined4 *)(local_cd8 + 0x1c);
                  local_c60 = auVar24;
                  do {
                    local_be0 = (float)uVar65;
                    fStack_bdc = (float)(uVar65 >> 0x20);
                    local_c34 = *(undefined4 *)(local_8c0 + lVar60 * 4);
                    local_c30 = *(undefined4 *)(local_8a0 + lVar60 * 4);
                    local_cc8->tfar = *(float *)(local_880 + lVar60 * 4);
                    local_c40 = *(undefined4 *)(local_860 + lVar60 * 4);
                    local_c3c = *(undefined4 *)(local_840 + lVar60 * 4);
                    local_c60._0_8_ = lVar60;
                    local_c38 = *(undefined4 *)(local_820 + lVar60 * 4);
                    local_c28 = (undefined4)uVar64;
                    local_c24 = *(uint *)local_a60._0_8_;
                    local_c20 = *(uint *)(local_a60._0_8_ + 4);
                    local_ccc = -1;
                    local_c10.valid = &local_ccc;
                    local_c10.geometryUserPtr = pGVar66->userPtr;
                    local_c10.context = (RTCRayQueryContext *)local_a60._0_8_;
                    local_c10.hit = (RTCHitN *)&local_c40;
                    local_c10.N = 1;
                    local_c10.ray = (RTCRayN *)local_cc8;
                    if (pGVar66->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_002c8867:
                      if ((pRVar67->filter == (RTCFilterFunctionN)0x0) ||
                         (((pRVar67->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          ((*(byte *)((long)local_ca0 + 0x3e) & 0x40) == 0)))) goto LAB_002c89f7;
                      (*pRVar67->filter)(&local_c10);
                      if (*local_c10.valid != 0) goto LAB_002c89f7;
                    }
                    else {
                      (*pGVar66->occlusionFilterN)(&local_c10);
                      pRVar67 = local_c80;
                      if (*local_c10.valid != 0) goto LAB_002c8867;
                    }
                    local_cc8->tfar = (float)local_ac0._0_4_;
                    uVar65 = CONCAT44(fStack_bdc,local_be0) ^ 1L << (local_c60._0_8_ & 0x3f);
                    lVar60 = 0;
                    if (uVar65 != 0) {
                      for (; (uVar65 >> lVar60 & 1) == 0; lVar60 = lVar60 + 1) {
                      }
                    }
                    context = (RayQueryContext *)local_b00._0_8_;
                    uVar64 = local_a80._0_8_;
                    pGVar66 = local_ca0;
                    pRVar67 = local_c80;
                    puVar68 = (ulong *)local_ae0._0_8_;
                    local_c2c = local_aa0._0_4_;
                  } while (uVar65 != 0);
                }
              }
            }
          }
          auVar151 = ZEXT1664(local_b10);
          auVar156 = ZEXT1664(local_b20);
          auVar159 = ZEXT1664(local_b30);
          auVar170 = ZEXT1664(local_b40);
          auVar180 = ZEXT1664(local_b50);
          auVar121 = ZEXT1664(local_b60);
          auVar188 = ZEXT1664(local_b70);
          auVar192 = ZEXT1664(local_b80);
          auVar103 = ZEXT1664(local_b90);
          auVar131 = ZEXT1664(local_ba0);
          auVar141 = ZEXT1664(local_bb0);
          uVar64 = local_cc0;
        }
        else {
          local_cd8 = uVar65 & 0xfffffffffffffff0;
          uVar65 = *(ulong *)(local_cd8 + 0x30 + (ulong)*(uint *)(local_cd8 + 0x2c));
          if (uVar65 != 0) {
            *puVar68 = uVar65;
            puVar68 = puVar68 + 1;
          }
        }
LAB_002c896d:
      } while (puVar68 != &local_800);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }